

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_38a::NinjaMain::EnsureBuildDirExists(NinjaMain *this)

{
  string *__lhs;
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"builddir",&local_69);
  BindingEnv::LookupVariable(&local_68,&(this->state_).bindings_,&local_48);
  __lhs = &this->build_dir_;
  std::__cxx11::string::operator=((string *)__lhs,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  bVar6 = true;
  if (((this->build_dir_)._M_string_length != 0) && (this->config_->dry_run == false)) {
    std::operator+(&local_68,__lhs,"/.");
    bVar3 = DiskInterface::MakeDirs(&(this->disk_interface_).super_DiskInterface,&local_68);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      std::__cxx11::string::~string((string *)&local_68);
      if (iVar1 != 0x11) {
        pcVar2 = (__lhs->_M_dataplus)._M_p;
        pcVar5 = strerror(*piVar4);
        bVar6 = false;
        Error("creating build directory %s: %s",pcVar2,pcVar5);
      }
    }
  }
  return bVar6;
}

Assistant:

bool NinjaMain::EnsureBuildDirExists() {
  build_dir_ = state_.bindings_.LookupVariable("builddir");
  if (!build_dir_.empty() && !config_.dry_run) {
    if (!disk_interface_.MakeDirs(build_dir_ + "/.") && errno != EEXIST) {
      Error("creating build directory %s: %s",
            build_dir_.c_str(), strerror(errno));
      return false;
    }
  }
  return true;
}